

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Operation<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::hugeint_t,_double> *state,hugeint_t *x,double *y,
          AggregateBinaryInput *binary)

{
  uint64_t uVar1;
  bool bVar2;
  hugeint_t x_data;
  
  if (*this != (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0) {
    x_data.upper = (int64_t)y;
    x_data.lower = (state->arg).lower;
    Execute<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>>
              (this,*(ArgMinMaxState<duckdb::hugeint_t,_double> **)state,x_data,(double)x->lower,
               binary);
    return;
  }
  bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    ((TemplatedValidityMask<unsigned_long> *)y[2],(idx_t)y[4]);
  if (bVar2) {
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)y[1],(idx_t)y[3]);
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)!bVar2;
    if (bVar2) {
      uVar1 = (state->arg).lower;
      *(undefined8 *)(this + 8) = *(undefined8 *)state;
      *(uint64_t *)(this + 0x10) = uVar1;
    }
    *(uint64_t *)(this + 0x18) = x->lower;
    *this = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}